

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool MultiplyInt64(int64_t a,int64_t b,int64_t *pRet)

{
  ulong uVar1;
  ulong uVar2;
  ulong *in_RDX;
  long lVar3;
  ulong in_RSI;
  ulong in_RDI;
  int64_t tmp_high;
  __int128 tmp;
  
  lVar3 = SUB168(SEXT816((long)in_RDI) * SEXT816((long)in_RSI),8);
  *in_RDX = in_RDI * in_RSI;
  if ((long)(in_RDI ^ in_RSI) < 0) {
    if (((lVar3 == -1) && ((long)*in_RDX < 0)) || ((lVar3 == 0 && (*in_RDX == 0)))) {
      return true;
    }
  }
  else if (lVar3 == 0) {
    uVar1 = *in_RDX;
    uVar2 = std::numeric_limits<long>::max();
    return uVar1 <= uVar2;
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR14 inline bool MultiplyInt64(std::int64_t a, std::int64_t b, std::int64_t* pRet) SAFEINT_NOTHROW
{
    __int128 tmp = (__int128)a * (__int128)b;
    *pRet = (std::int64_t)tmp;
    std::int64_t tmp_high = (std::int64_t)((unsigned __int128)tmp >> 64);

    // If only one input is negative, result must be negative, or zero
    if( (a ^ b) < 0 )
    {
        if( (tmp_high == -1 && *pRet < 0) ||
            (tmp_high == 0 && *pRet == 0))
        {
            return true;            
        } 
    }
    else
    {
        if (tmp_high == 0)
        {
            return (std::uint64_t)*pRet <= (std::uint64_t)std::numeric_limits<std::int64_t>::max();
        }
    }

    return false;
}